

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void process_func_decls_for_allocation(c2m_ctx_t c2m_ctx)

{
  check_ctx *pcVar1;
  type *type_00;
  undefined1 *puVar2;
  undefined1 *puVar3;
  char *pcVar4;
  int iVar5;
  size_t sVar6;
  decl_t pdVar7;
  decl_t *__base;
  mir_size_t round;
  mir_size_t mVar8;
  long local_58;
  mir_size_t start_offset;
  node_t_conflict scope;
  node_scope *curr_ns;
  node_scope *ns;
  type *type;
  decl_t decl;
  size_t j;
  size_t i;
  check_ctx_t check_ctx;
  c2m_ctx_t c2m_ctx_local;
  
  pcVar1 = c2m_ctx->check_ctx;
  local_58 = 0;
  decl = (decl_t)0x0;
  for (j = 0; sVar6 = VARR_decl_tlength(pcVar1->func_decls_for_allocation), j < sVar6; j = j + 1) {
    pdVar7 = VARR_decl_tget(pcVar1->func_decls_for_allocation,j);
    iVar5 = scalar_type_p((pdVar7->decl_spec).type);
    if (iVar5 == 0) {
      VARR_decl_tset(pcVar1->func_decls_for_allocation,(size_t)decl,pdVar7);
      decl = (decl_t)&decl->field_0x1;
    }
    else {
      *(byte *)pdVar7 = *(byte *)pdVar7 & 0xfd | 2;
    }
  }
  VARR_decl_ttrunc(pcVar1->func_decls_for_allocation,(size_t)decl);
  __base = VARR_decl_taddr(pcVar1->func_decls_for_allocation);
  qsort(__base,(size_t)decl,8,decl_cmp);
  start_offset = 0;
  for (j = 0; sVar6 = VARR_decl_tlength(pcVar1->func_decls_for_allocation), j < sVar6; j = j + 1) {
    pdVar7 = VARR_decl_tget(pcVar1->func_decls_for_allocation,j);
    type_00 = (pdVar7->decl_spec).type;
    puVar2 = (undefined1 *)pdVar7->scope->attr;
    if (pdVar7->scope != (node_t_conflict)start_offset) {
      start_offset = *(mir_size_t *)(puVar2 + 0x20);
      while ((node_t_conflict)start_offset != c2m_ctx->top_scope) {
        puVar3 = *(undefined1 **)(start_offset + 8);
        *(long *)(puVar2 + 0x10) = *(long *)(puVar3 + 8) + *(long *)(puVar2 + 0x10);
        *puVar3 = 1;
        start_offset = *(mir_size_t *)(puVar3 + 0x20);
      }
      start_offset = (mir_size_t)pdVar7->scope;
      *puVar2 = 1;
      local_58 = *(long *)(puVar2 + 0x10);
    }
    mVar8 = *(mir_size_t *)(puVar2 + 0x10);
    round = var_align(c2m_ctx,type_00);
    mVar8 = round_size(mVar8,round);
    *(mir_size_t *)(puVar2 + 0x10) = mVar8;
    pdVar7->offset = *(mir_size_t *)(puVar2 + 0x10);
    mVar8 = var_size(c2m_ctx,type_00);
    *(mir_size_t *)(puVar2 + 0x10) = mVar8 + *(long *)(puVar2 + 0x10);
    *(long *)(puVar2 + 8) = *(long *)(puVar2 + 0x10) - local_58;
  }
  start_offset = 0;
  for (j = 0; sVar6 = VARR_decl_tlength(pcVar1->func_decls_for_allocation), j < sVar6; j = j + 1) {
    pdVar7 = VARR_decl_tget(pcVar1->func_decls_for_allocation,j);
    pcVar4 = (char *)pdVar7->scope->attr;
    if (pdVar7->scope != (node_t_conflict)start_offset) {
      start_offset = *(mir_size_t *)(pcVar4 + 0x20);
      while ((node_t_conflict)start_offset != c2m_ctx->top_scope) {
        puVar2 = *(undefined1 **)(start_offset + 8);
        if (*(ulong *)(puVar2 + 8) < *(ulong *)(pcVar4 + 0x10)) {
          *(undefined8 *)(puVar2 + 8) = *(undefined8 *)(pcVar4 + 0x10);
        }
        if (*pcVar4 != '\0') {
          *puVar2 = 1;
        }
        start_offset = *(mir_size_t *)(puVar2 + 0x20);
      }
    }
  }
  return;
}

Assistant:

static void process_func_decls_for_allocation (c2m_ctx_t c2m_ctx) {
  check_ctx_t check_ctx = c2m_ctx->check_ctx;
  size_t i, j;
  decl_t decl;
  struct type *type;
  struct node_scope *ns, *curr_ns;
  node_t scope;
  mir_size_t start_offset = 0; /* to remove an uninitialized warning */

  /* Exclude decls which will be in regs: */
  for (i = j = 0; i < VARR_LENGTH (decl_t, func_decls_for_allocation); i++) {
    decl = VARR_GET (decl_t, func_decls_for_allocation, i);
    type = decl->decl_spec.type;
    ns = decl->scope->attr;
    if (scalar_type_p (type)) {
      decl->reg_p = TRUE;
      continue;
    }
    VARR_SET (decl_t, func_decls_for_allocation, j, decl);
    j++;
  }
  VARR_TRUNC (decl_t, func_decls_for_allocation, j);
  qsort (VARR_ADDR (decl_t, func_decls_for_allocation), j, sizeof (decl_t), decl_cmp);
  scope = NULL;
  for (i = 0; i < VARR_LENGTH (decl_t, func_decls_for_allocation); i++) {
    decl = VARR_GET (decl_t, func_decls_for_allocation, i);
    type = decl->decl_spec.type;
    ns = decl->scope->attr;
    if (decl->scope != scope) { /* new scope: process upper scopes */
      for (scope = ns->scope; scope != top_scope; scope = curr_ns->scope) {
        curr_ns = scope->attr;
        ns->offset += curr_ns->size;
        curr_ns->stack_var_p = TRUE;
      }
      scope = decl->scope;
      ns->stack_var_p = TRUE;
      start_offset = ns->offset;
    }
    ns->offset = round_size (ns->offset, var_align (c2m_ctx, type));
    decl->offset = ns->offset;
    ns->offset += var_size (c2m_ctx, type);
    ns->size = ns->offset - start_offset;
  }
  scope = NULL;
  for (i = 0; i < VARR_LENGTH (decl_t, func_decls_for_allocation); i++) { /* update scope sizes: */
    decl = VARR_GET (decl_t, func_decls_for_allocation, i);
    ns = decl->scope->attr;
    if (decl->scope == scope) continue;
    /* new scope: update upper scope sizes */
    for (scope = ns->scope; scope != top_scope; scope = curr_ns->scope) {
      curr_ns = scope->attr;
      if (curr_ns->size < ns->offset) curr_ns->size = ns->offset;
      if (ns->stack_var_p) curr_ns->stack_var_p = TRUE;
    }
  }
}